

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_string(TextReader *this,string *result)

{
  byte *pbVar1;
  char *pcVar2;
  char *pcVar3;
  string *out;
  undefined8 in_RDX;
  byte *pbVar4;
  ritobin *this_00;
  string_view data;
  string_view data_00;
  
  pbVar4 = (byte *)this->cur_;
  pbVar1 = (byte *)this->cap_;
  pcVar2 = (char *)CONCAT71((int7)((ulong)in_RDX >> 8),pbVar4 == pbVar1);
  if (pbVar4 != pbVar1) {
    this_00 = (ritobin *)(pbVar1 + -(long)pbVar4);
    out = (string *)0x100002200;
    do {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002200U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) {
        if ((char)pcVar2 != '\0') {
          return false;
        }
        if ((*pbVar4 != 0x27) && (*pbVar4 != 0x22)) {
          return false;
        }
        data._M_str = pcVar2;
        data._M_len = (size_t)pbVar4;
        pcVar2 = str_unquote_fetch_end(this_00,data);
        if (pcVar2 == this->cap_) {
          return false;
        }
        result->_M_string_length = 0;
        *(result->_M_dataplus)._M_p = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  (result,(long)pcVar2 - (long)this->cur_);
        data_00._M_len = this->cur_ + 1;
        this->cur_ = data_00._M_len;
        data_00._M_str = (char *)result;
        pcVar3 = str_unquote((ritobin *)(pcVar2 + -(long)data_00._M_len),data_00,out);
        this->cur_ = pcVar3;
        if (pcVar3 != pcVar2) {
          return false;
        }
        this->cur_ = pcVar3 + 1;
        return true;
      }
      pbVar4 = pbVar4 + 1;
      this->cur_ = (char *)pbVar4;
      this_00 = this_00 + -1;
      pcVar2 = (char *)CONCAT71((int7)((ulong)pcVar2 >> 8),pbVar4 == pbVar1);
    } while (pbVar4 != pbVar1);
  }
  return false;
}

Assistant:

bool read_string(std::string& result) noexcept {
            // FIXME: unicode verification
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            if (cur_ == cap_) {
                return false;
            }
            if (*cur_ != '"' && *cur_ != '\'') {
                return false;
            }
            auto quote_end = str_unquote_fetch_end(std::string_view{cur_, (size_t)(cap_ - cur_)});
            if (quote_end == cap_) {
                return false;
            }
            result.clear();
            result.reserve(quote_end - cur_);
            ++cur_;
            cur_ = str_unquote(std::string_view{cur_, (size_t)(quote_end - cur_)}, result);
            if (cur_ != quote_end) {
                return false;
            }
            cur_++;
            return true;
        }